

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

bool __thiscall
cmComputeLinkInformation::FinishLinkerSearchDirectories(cmComputeLinkInformation *this)

{
  pointer pcVar1;
  cmState *pcVar2;
  cmake *pcVar3;
  bool bVar4;
  PolicyStatus PVar5;
  ostream *poVar6;
  PolicyID id;
  bool bVar7;
  pointer fullPath;
  ostringstream w;
  string local_1f8;
  cmListFileBacktrace local_1d8;
  undefined1 local_198 [112];
  ios_base local_128 [264];
  
  bVar7 = true;
  if ((((this->OldLinkDirItems).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->OldLinkDirItems).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) &&
      ((this->OldUserFlagItems).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (this->OldUserFlagItems).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) && (this->OldLinkDirMode == true)) {
    PVar5 = cmPolicies::PolicyMap::Get(&this->Target->PolicyMap,CMP0003);
    if (PVar5 - REQUIRED_IF_USED < 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)&local_1d8,(cmPolicies *)0x3,id);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,local_1d8.Context.Name._M_dataplus._M_p,
                          local_1d8.Context.Name._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.Context.Name._M_dataplus._M_p != &local_1d8.Context.Name.field_2) {
        operator_delete(local_1d8.Context.Name._M_dataplus._M_p,
                        local_1d8.Context.Name.field_2._M_allocated_capacity + 1);
      }
      PrintLinkPolicyDiagnosis(this,(ostream *)local_198);
      pcVar3 = this->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmGeneratorTarget::GetBacktrace(&local_1d8,this->Target);
      cmake::IssueMessage(pcVar3,FATAL_ERROR,&local_1f8,&local_1d8,false);
      cmListFileBacktrace::~cmListFileBacktrace(&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base(local_128);
      bVar7 = false;
    }
    else if (PVar5 != NEW) {
      if (PVar5 == WARN) {
        pcVar2 = this->CMakeInstance->State;
        pcVar1 = local_198 + 0x10;
        local_198._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_198,"CMP0003-WARNING-GIVEN","");
        bVar4 = cmState::GetGlobalPropertyAsBool(pcVar2,(string *)local_198);
        if ((pointer)local_198._0_8_ != pcVar1) {
          operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
        }
        if (!bVar4) {
          pcVar2 = this->CMakeInstance->State;
          local_198._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_198,"CMP0003-WARNING-GIVEN","");
          cmState::SetGlobalProperty(pcVar2,(string *)local_198,"1");
          if ((pointer)local_198._0_8_ != pcVar1) {
            operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
          PrintLinkPolicyDiagnosis(this,(ostream *)local_198);
          pcVar3 = this->CMakeInstance;
          std::__cxx11::stringbuf::str();
          cmGeneratorTarget::GetBacktrace(&local_1d8,this->Target);
          cmake::IssueMessage(pcVar3,AUTHOR_WARNING,&local_1f8,&local_1d8,false);
          cmListFileBacktrace::~cmListFileBacktrace(&local_1d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
          std::ios_base::~ios_base(local_128);
        }
      }
      for (fullPath = (this->OldLinkDirItems).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          fullPath !=
          (this->OldLinkDirItems).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; fullPath = fullPath + 1) {
        cmOrderDirectories::AddLinkLibrary(this->OrderLinkerSearchPath,fullPath);
      }
    }
  }
  return bVar7;
}

Assistant:

std::string cmComputeLinkInformation::NoCaseExpression(const char* str)
{
  std::string ret;
  const char* s = str;
  while(*s)
    {
    if(*s == '.')
      {
      ret += *s;
      }
    else
      {
      ret += "[";
      ret += static_cast<char>(tolower(*s));
      ret += static_cast<char>(toupper(*s));
      ret += "]";
      }
    s++;
    }
  return ret;
}